

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O0

QueryResult * __thiscall
Query::run(Query *this,QueryPrimitive *primitive,PrefetchFunc *prefetcher,QueryCounters *counters)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  runtime_error *this_00;
  QueryPrimitive *in_RCX;
  Query *in_RDX;
  int *in_RSI;
  QueryResult *in_RDI;
  QueryCounters *in_R8;
  QueryResult next;
  Query *query_2;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<Query,_std::allocator<Query>_> *__range2_1;
  int nonempty_sources;
  int cutoff;
  vector<QueryResult_*,_std::allocator<QueryResult_*>_> results_ptrs;
  vector<QueryResult,_std::allocator<QueryResult>_> results;
  Query *query_1;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Query,_std::allocator<Query>_> *__range2;
  value_type *query;
  int i;
  int PRETECTH_RANGE;
  QueryResult *result;
  vector<Query,_std::allocator<Query>_> *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  QueryCounters *in_stack_fffffffffffffe18;
  undefined6 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe26;
  undefined1 in_stack_fffffffffffffe27;
  PrimitiveQuery in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  QueryResult *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  size_type in_stack_fffffffffffffe48;
  vector<QueryResult,_std::allocator<QueryResult>_> *in_stack_fffffffffffffe50;
  QueryCounter *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  int iVar4;
  QueryResult *in_stack_fffffffffffffe80;
  __normal_iterator<const_Query_*,_std::vector<Query,_std::allocator<Query>_>_> local_138;
  int *local_130;
  int local_128;
  int local_124;
  reference local_b8;
  Query *local_b0;
  __normal_iterator<const_Query_*,_std::vector<Query,_std::allocator<Query>_>_> local_a8;
  int *local_a0;
  undefined1 local_91;
  const_reference local_58;
  int local_3c;
  undefined1 local_35;
  undefined4 local_34;
  QueryCounters *in_stack_ffffffffffffffd0;
  
  if (*in_RSI == 1) {
    std::function<QueryResult_(PrimitiveQuery,_QueryCounters_*)>::operator()
              ((function<QueryResult_(PrimitiveQuery,_QueryCounters_*)> *)
               CONCAT17(in_stack_fffffffffffffe27,
                        CONCAT16(in_stack_fffffffffffffe26,in_stack_fffffffffffffe20)),
               in_stack_fffffffffffffe28,in_stack_fffffffffffffe18);
  }
  else {
    local_34 = 3;
    prefetch((Query *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
             (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),(int)in_stack_fffffffffffffe38,
             (bool)in_stack_fffffffffffffe37,(PrefetchFunc *)in_stack_fffffffffffffe28);
    if (*in_RSI == 2) {
      local_35 = 0;
      QueryResult::everything();
      local_3c = 0;
      while( true ) {
        uVar2 = (ulong)local_3c;
        sVar3 = std::vector<Query,_std::allocator<Query>_>::size
                          ((vector<Query,_std::allocator<Query>_> *)(in_RSI + 0xc));
        if (sVar3 <= uVar2) break;
        prefetch((Query *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                 (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),(int)in_stack_fffffffffffffe38,
                 (bool)in_stack_fffffffffffffe37,(PrefetchFunc *)in_stack_fffffffffffffe28);
        local_58 = std::vector<Query,_std::allocator<Query>_>::operator[]
                             ((vector<Query,_std::allocator<Query>_> *)(in_RSI + 0xc),(long)local_3c
                             );
        run(in_RDX,in_RCX,(PrefetchFunc *)in_R8,in_stack_ffffffffffffffd0);
        QueryCounters::ands(in_R8);
        QueryResult::do_and((QueryResult *)
                            CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                            in_stack_fffffffffffffe38,
                            (QueryCounter *)
                            CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
        QueryResult::~QueryResult((QueryResult *)0x1b9511);
        in_stack_fffffffffffffe47 =
             QueryResult::is_empty
                       ((QueryResult *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10)
                       );
        if ((bool)in_stack_fffffffffffffe47) {
          return in_RDI;
        }
        local_3c = local_3c + 1;
      }
    }
    else if (*in_RSI == 3) {
      local_91 = 0;
      QueryResult::empty();
      local_a0 = in_RSI + 0xc;
      local_a8._M_current =
           (Query *)std::vector<Query,_std::allocator<Query>_>::begin(in_stack_fffffffffffffe08);
      local_b0 = (Query *)std::vector<Query,_std::allocator<Query>_>::end(in_stack_fffffffffffffe08)
      ;
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_Query_*,_std::vector<Query,_std::allocator<Query>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                                (__normal_iterator<const_Query_*,_std::vector<Query,_std::allocator<Query>_>_>
                                 *)in_stack_fffffffffffffe08), bVar1) {
        local_b8 = __gnu_cxx::
                   __normal_iterator<const_Query_*,_std::vector<Query,_std::allocator<Query>_>_>::
                   operator*(&local_a8);
        run(in_RDX,in_RCX,(PrefetchFunc *)in_R8,in_stack_ffffffffffffffd0);
        QueryCounters::ors(in_R8);
        QueryResult::do_or(in_stack_fffffffffffffe80,
                           (QueryResult *)
                           CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                           in_stack_fffffffffffffe70);
        QueryResult::~QueryResult((QueryResult *)0x1b96a5);
        bVar1 = QueryResult::is_everything(in_RDI);
        if (bVar1) {
          return in_RDI;
        }
        __gnu_cxx::__normal_iterator<const_Query_*,_std::vector<Query,_std::allocator<Query>_>_>::
        operator++(&local_a8);
      }
    }
    else {
      if (*in_RSI != 4) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Unexpected query type");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::vector<QueryResult,_std::allocator<QueryResult>_>::vector
                ((vector<QueryResult,_std::allocator<QueryResult>_> *)0x1b975e);
      std::vector<QueryResult_*,_std::allocator<QueryResult_*>_>::vector
                ((vector<QueryResult_*,_std::allocator<QueryResult_*>_> *)0x1b976b);
      std::vector<Query,_std::allocator<Query>_>::size
                ((vector<Query,_std::allocator<Query>_> *)(in_RSI + 0xc));
      std::vector<QueryResult,_std::allocator<QueryResult>_>::reserve
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      std::vector<Query,_std::allocator<Query>_>::size
                ((vector<Query,_std::allocator<Query>_> *)(in_RSI + 0xc));
      std::vector<QueryResult_*,_std::allocator<QueryResult_*>_>::reserve
                ((vector<QueryResult_*,_std::allocator<QueryResult_*>_> *)
                 CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                 (size_type)in_stack_fffffffffffffe38);
      local_124 = in_RSI[10];
      sVar3 = std::vector<Query,_std::allocator<Query>_>::size
                        ((vector<Query,_std::allocator<Query>_> *)(in_RSI + 0xc));
      local_128 = (int)sVar3;
      local_130 = in_RSI + 0xc;
      local_138._M_current =
           (Query *)std::vector<Query,_std::allocator<Query>_>::begin(in_stack_fffffffffffffe08);
      std::vector<Query,_std::allocator<Query>_>::end(in_stack_fffffffffffffe08);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_Query_*,_std::vector<Query,_std::allocator<Query>_>_>
                            *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                           (__normal_iterator<const_Query_*,_std::vector<Query,_std::allocator<Query>_>_>
                            *)in_stack_fffffffffffffe08);
        iVar4 = (int)(in_stack_fffffffffffffe48 >> 0x20);
        if (!bVar1) break;
        __gnu_cxx::__normal_iterator<const_Query_*,_std::vector<Query,_std::allocator<Query>_>_>::
        operator*(&local_138);
        run(in_RDX,in_RCX,(PrefetchFunc *)in_R8,in_stack_ffffffffffffffd0);
        in_stack_fffffffffffffe27 =
             QueryResult::is_everything((QueryResult *)&stack0xfffffffffffffe80);
        if ((bool)in_stack_fffffffffffffe27) {
          local_124 = local_124 + -1;
          if (0 < local_124) goto LAB_001b9984;
          QueryResult::everything();
          iVar4 = 1;
        }
        else {
          in_stack_fffffffffffffe26 =
               QueryResult::is_empty
                         ((QueryResult *)
                          CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
          if ((bool)in_stack_fffffffffffffe26) {
            local_128 = local_128 + -1;
            if (local_128 < local_124) {
              QueryResult::empty();
              iVar4 = 1;
              goto LAB_001b998c;
            }
          }
          else {
            std::vector<QueryResult,_std::allocator<QueryResult>_>::emplace_back<QueryResult>
                      ((vector<QueryResult,_std::allocator<QueryResult>_> *)
                       CONCAT17(in_stack_fffffffffffffe27,
                                CONCAT16(in_stack_fffffffffffffe26,in_stack_fffffffffffffe20)),
                       (QueryResult *)in_stack_fffffffffffffe18);
            std::vector<QueryResult,_std::allocator<QueryResult>_>::back
                      ((vector<QueryResult,_std::allocator<QueryResult>_> *)
                       CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
            std::vector<QueryResult*,std::allocator<QueryResult*>>::emplace_back<QueryResult*>
                      ((vector<QueryResult_*,_std::allocator<QueryResult_*>_> *)
                       CONCAT17(in_stack_fffffffffffffe27,
                                CONCAT16(in_stack_fffffffffffffe26,in_stack_fffffffffffffe20)),
                       (QueryResult **)in_stack_fffffffffffffe18);
          }
LAB_001b9984:
          iVar4 = 0;
        }
LAB_001b998c:
        QueryResult::~QueryResult((QueryResult *)0x1b9996);
        if (iVar4 != 0) goto LAB_001b99f8;
        __gnu_cxx::__normal_iterator<const_Query_*,_std::vector<Query,_std::allocator<Query>_>_>::
        operator++(&local_138);
      }
      QueryCounters::minofs(in_R8);
      QueryResult::do_min_of
                (iVar4,(vector<QueryResult_*,_std::allocator<QueryResult_*>_> *)
                       CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                 (QueryCounter *)in_stack_fffffffffffffe38);
LAB_001b99f8:
      std::vector<QueryResult_*,_std::allocator<QueryResult_*>_>::~vector
                ((vector<QueryResult_*,_std::allocator<QueryResult_*>_> *)
                 CONCAT17(in_stack_fffffffffffffe27,
                          CONCAT16(in_stack_fffffffffffffe26,in_stack_fffffffffffffe20)));
      std::vector<QueryResult,_std::allocator<QueryResult>_>::~vector
                ((vector<QueryResult,_std::allocator<QueryResult>_> *)
                 CONCAT17(in_stack_fffffffffffffe27,
                          CONCAT16(in_stack_fffffffffffffe26,in_stack_fffffffffffffe20)));
    }
  }
  return in_RDI;
}

Assistant:

QueryResult Query::run(const QueryPrimitive &primitive,
                       const PrefetchFunc &prefetcher,
                       QueryCounters *counters) const {
    // Case: primitive query - reduces to AND with tokens from query plan.
    if (type == QueryType::PRIMITIVE) {
        return primitive(ngram, counters);
    }

    constexpr int PRETECTH_RANGE = 3;
    prefetch(0, PRETECTH_RANGE, false, prefetcher);

    // Case: and. Short circuits when result is already empty.
    if (type == QueryType::AND) {
        auto result = QueryResult::everything();
        for (int i = 0; i < queries.size(); i++) {
            prefetch(i + 1, PRETECTH_RANGE, true, prefetcher);
            const auto &query = queries[i];
            result.do_and(query.run(primitive, prefetcher, counters),
                          &counters->ands());
            if (result.is_empty()) {
                break;
            }
        }
        return result;
    }
    // Case: or. Short circuits when result is already everything.
    if (type == QueryType::OR) {
        auto result = QueryResult::empty();
        for (auto &query : queries) {
            result.do_or(query.run(primitive, prefetcher, counters),
                         &counters->ors());
            if (result.is_everything()) {
                break;
            }
        }
        return result;
    }
    // Case: minof. We remove `everything` and `empty` sets from inputs, and
    // adjust cutoff or input size appropriately. Short circuits in two cases:
    // - cutoff is <= 0 (for example: 0 of ("a", "b")).
    // - cutoff is > size(inputs) (for example: 3 of ("a", "b"))
    // There is some logic duplication here and in QueryResult::do_min_of_real.
    if (type == QueryType::MIN_OF) {
        std::vector<QueryResult> results;
        std::vector<QueryResult *> results_ptrs;
        results.reserve(queries.size());
        results_ptrs.reserve(queries.size());
        int cutoff = count;
        int nonempty_sources = queries.size();
        for (const auto &query : queries) {
            QueryResult next = query.run(primitive, prefetcher, counters);
            if (next.is_everything()) {
                cutoff -= 1;
                if (cutoff <= 0) {
                    return QueryResult::everything();
                }
            } else if (next.is_empty()) {
                nonempty_sources -= 1;
                if (cutoff > nonempty_sources) {
                    return QueryResult::empty();
                }
            } else {
                results.emplace_back(std::move(next));
                results_ptrs.emplace_back(&results.back());
            }
        }
        return QueryResult::do_min_of(cutoff, results_ptrs,
                                      &counters->minofs());
    }
    throw std::runtime_error("Unexpected query type");
}